

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kv_instance.cc
# Opt level: O0

void fdb_kvs_header_free(filemgr *file)

{
  long in_RDI;
  
  if (*(long *)(in_RDI + 0x170) != 0) {
    _fdb_kvs_header_free((kvs_header *)file);
    *(undefined8 *)(in_RDI + 0x170) = 0;
  }
  return;
}

Assistant:

void _fdb_kvs_header_free(struct kvs_header *kv_header)
{
    struct kvs_node *node;
    struct avl_node *a;

    a = avl_first(kv_header->idx_name);
    while (a) {
        node = _get_entry(a, struct kvs_node, avl_name);
        a = avl_next(a);
        avl_remove(kv_header->idx_name, &node->avl_name);

        free(node->kvs_name);
        free(node);
    }
    free(kv_header->idx_name);
    free(kv_header->idx_id);
    free(kv_header);
}